

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

int16_t * __thiscall
sptk::reaper::EpochTracker::HighpassFilter
          (EpochTracker *this,int16_t *input,int32_t n_input,float sample_rate,float corner_freq,
          float fir_duration)

{
  bool bVar1;
  int nIn;
  bool first;
  int iVar2;
  int iVar3;
  int16_t *piVar4;
  int32_t iVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  FdFilter filter;
  
  FdFilter::FdFilter(&filter,sample_rate,corner_freq,true,fir_duration,false);
  uVar6 = 0xffffffffffffffff;
  if (-1 < n_input) {
    uVar6 = (ulong)(uint)n_input * 2;
  }
  piVar4 = (int16_t *)operator_new__(uVar6);
  iVar2 = FdFilter::GetMaxInputSize(&filter);
  first = true;
  iVar8 = 0;
  iVar9 = 0;
  bVar7 = 0;
  for (iVar5 = n_input; 0 < iVar5; iVar5 = iVar5 - nIn) {
    nIn = iVar2;
    if (iVar5 < iVar2) {
      nIn = iVar5;
    }
    bVar1 = iVar5 <= iVar2;
    iVar3 = FdFilter::FilterArray
                      (&filter,input + iVar8,nIn,first,(bool)(bVar7 | bVar1),piVar4 + iVar9,
                       n_input - iVar9);
    iVar8 = iVar8 + nIn;
    iVar9 = iVar9 + iVar3;
    first = false;
    bVar7 = bVar7 | bVar1;
  }
  FdFilter::~FdFilter(&filter);
  return piVar4;
}

Assistant:

int16_t* EpochTracker::HighpassFilter(int16_t* input, int32_t n_input,
                                      float sample_rate, float corner_freq,
				      float fir_duration) {
  FdFilter filter(sample_rate, corner_freq, true, fir_duration, false);
  int16_t* filtered_data = new int16_t[n_input];
  int32_t max_buffer_size = filter.GetMaxInputSize();
  int32_t to_process = n_input;
  bool start = true;
  bool end = false;
  int32_t input_index = 0;
  int32_t output_index = 0;
  while (to_process > 0) {
    int32_t to_send = to_process;
    if (to_send > max_buffer_size) {
      to_send = max_buffer_size;
    } else {
      end = true;
    }
    int32_t samples_returned = filter.FilterArray(input + input_index, to_send,
                                                  start, end,
                                                  filtered_data + output_index,
                                                  n_input - output_index);
    input_index += to_send;
    to_process -= to_send;
    output_index += samples_returned;
    start = false;
  }
  return filtered_data;
}